

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>::
reserve(vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
        *this,size_t n)

{
  memory_resource *pmVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar3 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 8,8);
    sVar2 = this->nStored;
    if (sVar2 != 0) {
      sVar4 = 0;
      do {
        ((TriangleMesh **)CONCAT44(extraout_var,iVar3))[sVar4] = this->ptr[sVar4];
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 3,8);
    this->nAlloc = n;
    this->ptr = (TriangleMesh **)CONCAT44(extraout_var,iVar3);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }